

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O2

void WriteFramePPM(GB *gb,char *filename)

{
  uint uVar1;
  ostream *poVar2;
  undefined8 uVar3;
  runtime_error *prVar4;
  u8 *puVar5;
  long lVar6;
  allocator local_299;
  undefined8 local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_270;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  ofstream file;
  undefined8 auStack_220 [2];
  byte abStack_210 [480];
  
  std::ofstream::ofstream(&file,filename,_S_out);
  if ((abStack_210[*(long *)(_file + -0x18)] & 5) != 0) {
    prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_290,"Failed to open file \"",&local_299);
    std::operator+(&local_270,&local_290,filename);
    std::operator+(&local_250,&local_270,"\".");
    std::runtime_error::runtime_error(prVar4,(string *)&local_250);
    __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::operator<<((ostream *)&file,"P3\n160 144\n255\n");
  puVar5 = (gb->s).ppu_buffer;
  uVar3 = 0;
  while ((char)uVar3 != -0x70) {
    local_298 = uVar3;
    for (lVar6 = 0; (char)lVar6 != -0x60; lVar6 = lVar6 + 1) {
      uVar1 = *(uint *)(&DAT_0010d240 + (ulong)puVar5[lVar6] * 4);
      *(undefined8 *)((long)auStack_220 + *(long *)(_file + -0x18)) = 3;
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&file,uVar1 & 0xff);
      poVar2 = std::operator<<(poVar2,' ');
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 3;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1 >> 8 & 0xff);
      poVar2 = std::operator<<(poVar2,' ');
      *(undefined8 *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x10) = 3;
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,uVar1 >> 0x10 & 0xff);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)&file,'\n');
    puVar5 = puVar5 + lVar6;
    uVar3 = CONCAT71((int7)((ulong)local_298 >> 8),(char)local_298 + '\x01');
  }
  if ((abStack_210[*(long *)(_file + -0x18)] & 1) == 0) {
    std::ofstream::~ofstream(&file);
    return;
  }
  prVar4 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar4,"Failed to write file.");
  __cxa_throw(prVar4,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void WriteFramePPM(const GB& gb, const char* filename) {
  std::ofstream file(filename, std::ios::out);
  if (!file) {
    throw Error(std::string("Failed to open file \"") + filename + "\".");
  }
  u32 colors[] = {0xffffffffu, 0xffaaaaaau, 0xff555555u, 0xff000000u};
  file << "P3\n160 144\n255\n";
  u8 x, y;
  const u8* data = gb.s.ppu_buffer;
  for (y = 0; y < 144; ++y) {
    for (x = 0; x < 160; ++x) {
      u32 pixel = colors[*data++];
      int b = (pixel >> 16) & 0xff;
      int g = (pixel >> 8) & 0xff;
      int r = (pixel >> 0) & 0xff;
      file << std::setw(3) << r << ' ' << std::setw(3) << g << ' '
           << std::setw(3) << b << ' ';
    }
    file << '\n';
  }
  if (file.bad()) {
    throw Error("Failed to write file.");
  }
}